

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall ON_Hatch::GetBBox(ON_Hatch *this,double *bmin,double *bmax,bool bGrowBox)

{
  int iVar1;
  int iVar2;
  ON_Curve *pOVar3;
  byte local_61;
  ON_Curve *pC;
  int iStack_28;
  bool rc;
  int count;
  int i;
  bool bGrowBox_local;
  double *bmax_local;
  double *bmin_local;
  ON_Hatch *this_local;
  
  iVar1 = ON_SimpleArray<ON_HatchLoop_*>::Count(&this->m_loops);
  pC._3_1_ = true;
  for (iStack_28 = 0; pC._3_1_ != false && iStack_28 < iVar1; iStack_28 = iStack_28 + 1) {
    pOVar3 = LoopCurve3d(this,iStack_28);
    if (pOVar3 != (ON_Curve *)0x0) {
      local_61 = bGrowBox;
      if (iStack_28 != 0) {
        local_61 = 1;
      }
      iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                        (pOVar3,bmin,bmax,(ulong)(local_61 & 1));
      pC._3_1_ = (bool)((byte)iVar2 & 1);
      if (pOVar3 != (ON_Curve *)0x0) {
        (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
    }
  }
  return pC._3_1_;
}

Assistant:

bool ON_Hatch::GetBBox( double* bmin, double* bmax, bool bGrowBox) const
{
  int i;
  int count = m_loops.Count();
  bool rc = true;
  ON_Curve* pC;
  for( i = 0; rc && i < count; i++)
  {
    pC = LoopCurve3d( i);
    if( pC)
    {
      rc = pC->GetBBox( bmin, bmax, i?true:bGrowBox);
      delete pC;
    }
  }
  return rc;
}